

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

IntermediateNode *
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::
assimilate(IntermediateNode *orig)

{
  SListIntermediateNode *pSVar1;
  Node *in_RDI;
  IntermediateNode *unaff_retaddr;
  IntermediateNode *res;
  SListIntermediateNode *pSVar2;
  TermList in_stack_ffffffffffffffd0;
  
  pSVar1 = (SListIntermediateNode *)operator_new(0x3e522c);
  pSVar2 = pSVar1;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node::term(in_RDI);
  SListIntermediateNode(pSVar2,in_stack_ffffffffffffffd0,(uint)((ulong)pSVar1 >> 0x20));
  pSVar2 = pSVar1;
  (*in_RDI->_vptr_Node[8])();
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::IntermediateNode::loadChildren
            (unaff_retaddr,(NodeIterator *)in_RDI);
  Lib::
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                      *)pSVar2);
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::IntermediateNode::makeEmpty
            (&pSVar2->super_IntermediateNode);
  if (in_RDI != (Node *)0x0) {
    (*in_RDI->_vptr_Node[1])();
  }
  return &pSVar1->super_IntermediateNode;
}

Assistant:

typename SubstitutionTree<LeafData_>::IntermediateNode* SubstitutionTree<LeafData_>::SListIntermediateNode
	::assimilate(IntermediateNode* orig)
{
  IntermediateNode* res= 0;
  // TODO refactor such that children are not copied here, and deleted at (2), but moved instead
  res = new SListIntermediateNode(orig->term(), orig->childVar);
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  // TODO (2) see above
  delete orig;
  return res;
}